

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Rml::Property::Get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Property *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Property *local_18;
  Property *this_local;
  
  local_18 = this;
  this_local = (Property *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)&local_38);
  Variant::Get<std::__cxx11::string>(__return_storage_ptr__,&this->value,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

T Get() const
	{
		return value.Get<T>();
	}